

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

channel_s * fio_filter_dup_lock_internal(channel_s *ch,uint64_t hashed,fio_collection_s *c)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  uintptr_t uVar4;
  fio_ch_set__ordered_s_ *pfVar5;
  fio_ch_set__map_s_ *pfVar6;
  channel_s *pcVar7;
  ulong hash_value;
  fio_lock_i ret;
  
  fio_lock(&c->lock);
  hash_value = -(ulong)(hashed == 0) | hashed;
  uVar2 = (c->channels).count;
  uVar3 = (c->channels).pos;
  if (uVar3 - uVar2 <= uVar2 >> 1) {
    if (uVar3 < (c->channels).capa) goto LAB_00114f3c;
    puVar1 = &(c->channels).used_bits;
    *puVar1 = *puVar1 + '\x01';
  }
  fio_ch_set_rehash(&c->channels);
LAB_00114f3c:
  pfVar6 = fio_ch_set__find_map_pos_(&c->channels,hash_value,ch);
  if (pfVar6 == (fio_ch_set__map_s_ *)0x0) {
    pcVar7 = fio_channel_copy(ch);
    uVar4 = (c->channels).pos;
    pfVar5 = (c->channels).ordered;
    pfVar5[uVar4].obj = pcVar7;
    pfVar5[uVar4].hash = hash_value;
    (c->channels).pos = uVar4 + 1;
    (c->channels).count = (c->channels).count + 1;
    fio_ch_set_rehash(&c->channels);
    pcVar7 = (c->channels).ordered[(c->channels).pos - 1].obj;
  }
  else if (pfVar6->pos == (fio_ch_set__ordered_s_ *)0x0) {
    uVar4 = (c->channels).pos;
    pfVar5 = (c->channels).ordered;
    pfVar6->pos = pfVar5 + uVar4;
    (c->channels).pos = uVar4 + 1;
    (c->channels).count = (c->channels).count + 1;
    pfVar6->hash = hash_value;
    pfVar5[uVar4].hash = hash_value;
    pcVar7 = fio_channel_copy(ch);
    pfVar6->pos->obj = pcVar7;
  }
  else {
    fio_channel_free(ch);
    pcVar7 = pfVar6->pos->obj;
  }
  if (pcVar7 != (channel_s *)0x0) {
    LOCK();
    pcVar7->ref = pcVar7->ref + 1;
    UNLOCK();
  }
  fio_lock(&pcVar7->lock);
  LOCK();
  c->lock = '\0';
  UNLOCK();
  return pcVar7;
}

Assistant:

static inline channel_s *fio_filter_dup_lock_internal(channel_s *ch,
                                                      uint64_t hashed,
                                                      fio_collection_s *c) {
  fio_lock(&c->lock);
  ch = fio_ch_set_insert(&c->channels, hashed, ch);
  fio_channel_dup(ch);
  fio_lock(&ch->lock);
  fio_unlock(&c->lock);
  return ch;
}